

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O2

void __thiscall
ExampleNLFeeder::
WriteDense2Sparse<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SingleSparseVecWrtFactory<int,double>,double[2]>
          (ExampleNLFeeder *this,SingleSparseVecWrtFactory<int,_double> *gw,double (*vec) [2])

{
  SparseVectorWriter<int,_double> gvw;
  
  CountNNZ<double[2]>(this,vec);
  mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::
  SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
            ((SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd0,(size_t)gw);
  WriteDense2Sparse_Pure<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SparseVectorWriter<int,double>,2ul>
            (this,(SparseVectorWriter<int,_double> *)&stack0xffffffffffffffd0,vec);
  return;
}

Assistant:

void WriteDense2Sparse(GradWriterFactory& gw, const DenseVec& vec) {
    auto gvw = gw.MakeVectorWriter(CountNNZ(vec));
    WriteDense2Sparse_Pure(gvw, vec);
  }